

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O0

void __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::dfs_red
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,zg_t *ts,
          graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
          stats_t *stats,node_sptr_t *n)

{
  _Map_pointer n_00;
  bool bVar1;
  unsigned_long *puVar2;
  node_t *pnVar3;
  color_t *pcVar4;
  bool *pbVar5;
  undefined1 local_100 [44];
  int local_d4;
  node_sptr_t t;
  red_stack_entry_t *top;
  undefined1 local_b0 [40];
  undefined1 local_88 [8];
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
  stack;
  node_sptr_t *n_local;
  stats_t *stats_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels_local;
  graph_t *graph_local;
  zg_t *ts_local;
  algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this_local;
  
  stack.c.
  super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)n;
  std::
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>>
  ::
  stack<std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>,void>
            ((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>>>
              *)local_88);
  n_00 = stack.c.
         super__Deque_base<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
  tchecker::graph::reachability::
  graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
  ::outgoing_edges((graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                    *)local_b0,(node_sptr_t *)graph);
  red_stack_entry_t::red_stack_entry_t
            ((red_stack_entry_t *)(local_b0 + 0x10),(node_sptr_t *)n_00,
             (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
              *)local_b0);
  std::
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
  ::push((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
          *)local_88,(value_type *)(local_b0 + 0x10));
  red_stack_entry_t::~red_stack_entry_t((red_stack_entry_t *)(local_b0 + 0x10));
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
  ::~range_t((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
              *)local_b0);
  puVar2 = stats_t::visited_states_red(stats);
  *puVar2 = *puVar2 + 1;
  do {
    while( true ) {
      bVar1 = std::
              stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
              ::empty((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
                       *)local_88);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0015f2aa;
      t._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
              *)std::
                stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
                ::top((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
                       *)local_88);
      bVar1 = red_stack_entry_t::has_successor((red_stack_entry_t *)t._t);
      if (bVar1) break;
      std::
      stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
      ::pop((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
             *)local_88);
    }
    red_stack_entry_t::pick_successor((red_stack_entry_t *)&stack0xffffffffffffff30,(graph_t *)t._t)
    ;
    puVar2 = stats_t::visited_transitions_red(stats);
    *puVar2 = *puVar2 + 1;
    pnVar3 = (node_t *)
             intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
             ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                           *)&stack0xffffffffffffff30);
    pcVar4 = ndfs::node_t::color(pnVar3);
    if (*pcVar4 == CYAN) {
      pbVar5 = stats_t::cycle(stats);
      *pbVar5 = true;
      local_d4 = 3;
    }
    else {
      pnVar3 = (node_t *)
               intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
               ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                             *)&stack0xffffffffffffff30);
      pcVar4 = ndfs::node_t::color(pnVar3);
      if (*pcVar4 == BLUE) {
        pnVar3 = (node_t *)
                 intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                 ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                               *)&stack0xffffffffffffff30);
        pcVar4 = ndfs::node_t::color(pnVar3);
        *pcVar4 = RED;
        tchecker::graph::reachability::
        graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
        ::outgoing_edges((graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                          *)local_100,(node_sptr_t *)graph);
        red_stack_entry_t::red_stack_entry_t
                  ((red_stack_entry_t *)(local_100 + 0x10),(node_sptr_t *)&stack0xffffffffffffff30,
                   (range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                    *)local_100);
        std::
        stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
        ::push((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
                *)local_88,(value_type *)(local_100 + 0x10));
        red_stack_entry_t::~red_stack_entry_t((red_stack_entry_t *)(local_100 + 0x10));
        range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
        ::~range_t((range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>
                    *)local_100);
        puVar2 = stats_t::visited_states_red(stats);
        *puVar2 = *puVar2 + 1;
      }
      local_d4 = 0;
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                *)&stack0xffffffffffffff30);
  } while (local_d4 == 0);
LAB_0015f2aa:
  std::
  stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
  ::~stack((stack<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::deque<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t,_std::allocator<tchecker::algorithms::ndfs::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::red_stack_entry_t>_>_>
            *)local_88);
  return;
}

Assistant:

void dfs_red(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels, tchecker::algorithms::ndfs::stats_t & stats,
               node_sptr_t & n)
  {
    std::stack<red_stack_entry_t> stack;

    stack.push(red_stack_entry_t{n, graph.outgoing_edges(n)});
    ++stats.visited_states_red();

    while (!stack.empty()) {
      red_stack_entry_t & top = stack.top();
      if (!top.has_successor())
        stack.pop();
      else {
        node_sptr_t t = top.pick_successor(graph);
        ++stats.visited_transitions_red();
        if (t->color() == tchecker::algorithms::ndfs::CYAN) {
          stats.cycle() = true;
          break;
        }
        else if (t->color() == tchecker::algorithms::ndfs::BLUE) {
          t->color() = tchecker::algorithms::ndfs::RED;
          stack.push(red_stack_entry_t{t, graph.outgoing_edges(t)});
          ++stats.visited_states_red();
        }
      }
    }
  }